

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_mwhere(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  short sVar2;
  CHAR_DATA *pCVar3;
  bool bVar4;
  bool bVar5;
  BUFFER *buffer;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  CHAR_DATA **victim;
  DESCRIPTOR_DATA **ppDVar11;
  undefined8 in_stack_ffffffffffffeda8;
  undefined4 uVar12;
  char buf [4608];
  
  cVar1 = *argument;
  buffer = new_buf();
  if (cVar1 == '\0') {
    ppDVar11 = &descriptor_list;
    uVar10 = 0;
    while (ppDVar11 = &((DESCRIPTOR_DATA *)ppDVar11)->next->next,
          (DESCRIPTOR_DATA *)ppDVar11 != (DESCRIPTOR_DATA *)0x0) {
      pCVar3 = ((DESCRIPTOR_DATA *)ppDVar11)->character;
      if ((((pCVar3 != (CHAR_DATA *)0x0) && (((DESCRIPTOR_DATA *)ppDVar11)->connected == 0)) &&
          (pCVar3->in_room != (ROOM_INDEX_DATA *)0x0)) && (bVar5 = can_see(ch,pCVar3), bVar5)) {
        bVar5 = can_see_room(ch,((DESCRIPTOR_DATA *)ppDVar11)->character->in_room);
        uVar12 = (undefined4)((ulong)in_stack_ffffffffffffeda8 >> 0x20);
        if (bVar5) {
          pCVar3 = ((DESCRIPTOR_DATA *)ppDVar11)->character;
          uVar10 = uVar10 + 1;
          if (((DESCRIPTOR_DATA *)ppDVar11)->original == (CHAR_DATA *)0x0) {
            bVar5 = is_npc(pCVar3);
            pcVar8 = (&pCVar3->name)[!bVar5];
            pcVar6 = get_room_name(pCVar3->in_room);
            sprintf(buf,"%3d) %s is in %s [%d]\n\r",(ulong)uVar10,pcVar8,pcVar6,
                    (ulong)(uint)(int)pCVar3->in_room->vnum);
          }
          else {
            pcVar8 = ((DESCRIPTOR_DATA *)ppDVar11)->original->true_name;
            pcVar6 = pCVar3->short_descr;
            pcVar7 = get_room_name(pCVar3->in_room);
            in_stack_ffffffffffffeda8 = CONCAT44(uVar12,(int)pCVar3->in_room->vnum);
            sprintf(buf,"%3d) %s (in the body of %s) is in %s [%d]\n\r",(ulong)uVar10,pcVar8,pcVar6,
                    pcVar7,in_stack_ffffffffffffeda8);
          }
          add_buf(buffer,buf);
        }
      }
    }
  }
  else {
    bVar5 = false;
    victim = &char_list;
    uVar10 = 0;
    while (victim = &((CHAR_DATA *)victim)->next->next, (CHAR_DATA *)victim != (CHAR_DATA *)0x0) {
      if (((((CHAR_DATA *)victim)->in_room != (ROOM_INDEX_DATA *)0x0) &&
          (bVar4 = can_see(ch,(CHAR_DATA *)victim), bVar4)) &&
         (bVar4 = is_name(argument,((CHAR_DATA *)victim)->name), bVar4)) {
        bVar5 = is_npc((CHAR_DATA *)victim);
        iVar9 = 0;
        if (bVar5) {
          iVar9 = (int)((CHAR_DATA *)victim)->pIndexData->vnum;
        }
        uVar10 = uVar10 + 1;
        bVar5 = is_npc((CHAR_DATA *)victim);
        pcVar8 = (&((CHAR_DATA *)victim)->name)[(ulong)bVar5 * 4];
        sVar2 = ((CHAR_DATA *)victim)->in_room->vnum;
        pcVar6 = get_room_name(((CHAR_DATA *)victim)->in_room);
        sprintf(buf,"%3d) [%5d] %-28s [%5d] %s\n\r",(ulong)uVar10,iVar9,pcVar8,
                (ulong)(uint)(int)sVar2,pcVar6);
        add_buf(buffer,buf);
        bVar5 = true;
      }
    }
    if (!bVar5) {
      act("You didn\'t find any $T.",ch,(void *)0x0,argument,3);
      goto LAB_002ca1a5;
    }
  }
  pcVar8 = buf_string(buffer);
  page_to_char(pcVar8,ch);
LAB_002ca1a5:
  free_buf(buffer);
  return;
}

Assistant:

void do_mwhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	BUFFER *buffer;
	CHAR_DATA *victim;
	bool found;
	int count = 0;

	if (argument[0] == '\0')
	{
		DESCRIPTOR_DATA *d;

		/* show characters logged */

		buffer = new_buf();
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->character != nullptr
				&& d->connected == CON_PLAYING
				&& d->character->in_room != nullptr
				&& can_see(ch, d->character)
				&& can_see_room(ch, d->character->in_room))
			{
				victim = d->character;
				count++;

				if (d->original != nullptr)
				{
					sprintf(buf, "%3d) %s (in the body of %s) is in %s [%d]\n\r",
						count,
						d->original->true_name,
						victim->short_descr,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}
				else
				{
					sprintf(buf, "%3d) %s is in %s [%d]\n\r",
						count,
						is_npc(victim) ? victim->name : victim->true_name,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}

				add_buf(buffer, buf);
			}
		}

		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		return;
	}

	found = false;
	buffer = new_buf();

	for (victim = char_list; victim != nullptr; victim = victim->next)
	{
		if (victim->in_room != nullptr && can_see(ch, victim) && is_name(argument, victim->name))
		{
			found = true;
			count++;

			sprintf(buf, "%3d) [%5d] %-28s [%5d] %s\n\r",
				count,
				is_npc(victim) ? victim->pIndexData->vnum : 0,
				is_npc(victim) ? victim->short_descr : victim->name,
				victim->in_room->vnum,
				get_room_name(victim->in_room));
			add_buf(buffer, buf);
		}
	}

	if (!found)
		act("You didn't find any $T.", ch, nullptr, argument, TO_CHAR);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}